

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

PgHdr * pcacheMergeDirtyList(PgHdr *pA,PgHdr *pB)

{
  PgHdr *pPVar1;
  PgHdr *pPVar2;
  PgHdr *local_68;
  PgHdr *pTail;
  PgHdr result;
  PgHdr *pB_local;
  PgHdr *pA_local;
  
  local_68 = (PgHdr *)&pTail;
  pPVar1 = pB;
  pPVar2 = pA;
  do {
    while (pB_local = pPVar2, result.pDirtyPrev = pPVar1,
          (result.pDirtyPrev)->pgno <= pB_local->pgno) {
      local_68->pDirty = result.pDirtyPrev;
      local_68 = result.pDirtyPrev;
      pPVar1 = (result.pDirtyPrev)->pDirty;
      pPVar2 = pB_local;
      if ((result.pDirtyPrev)->pDirty == (PgHdr *)0x0) {
        (result.pDirtyPrev)->pDirty = pB_local;
        return (PgHdr *)result.pCache;
      }
    }
    local_68->pDirty = pB_local;
    local_68 = pB_local;
    pPVar1 = result.pDirtyPrev;
    pPVar2 = pB_local->pDirty;
  } while (pB_local->pDirty != (PgHdr *)0x0);
  pB_local->pDirty = result.pDirtyPrev;
  return (PgHdr *)result.pCache;
}

Assistant:

static PgHdr *pcacheMergeDirtyList(PgHdr *pA, PgHdr *pB){
  PgHdr result, *pTail;
  pTail = &result;
  assert( pA!=0 && pB!=0 );
  for(;;){
    if( pA->pgno<pB->pgno ){
      pTail->pDirty = pA;
      pTail = pA;
      pA = pA->pDirty;
      if( pA==0 ){
        pTail->pDirty = pB;
        break;
      }
    }else{
      pTail->pDirty = pB;
      pTail = pB;
      pB = pB->pDirty;
      if( pB==0 ){
        pTail->pDirty = pA;
        break;
      }
    }
  }
  return result.pDirty;
}